

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int strncpy_s(char *dst,size_t dstSizeInBytes,char *src,size_t maxCount)

{
  bool bVar1;
  size_t local_38;
  size_t srcLength;
  int truncationFlag;
  int result;
  size_t maxCount_local;
  char *src_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  
  bVar1 = false;
  if (dst == (char *)0x0) {
    srcLength._4_4_ = 0x16;
  }
  else if (src == (char *)0x0) {
    *dst = '\0';
    srcLength._4_4_ = 0x16;
  }
  else if (dstSizeInBytes == 0) {
    srcLength._4_4_ = 0x16;
  }
  else {
    local_38 = strlen(src);
    if (maxCount == 0xffffffffffffffff) {
      bVar1 = dstSizeInBytes < local_38 + 1;
      if (bVar1) {
        local_38 = dstSizeInBytes - 1;
      }
      memcpy(dst,src,local_38);
      dst[local_38] = '\0';
      srcLength._4_4_ = 0;
    }
    else {
      if (maxCount < local_38) {
        local_38 = maxCount;
      }
      if (dstSizeInBytes < local_38 + 1) {
        *dst = '\0';
        srcLength._4_4_ = 0x22;
      }
      else {
        memcpy(dst,src,local_38);
        dst[local_38] = '\0';
        srcLength._4_4_ = 0;
      }
    }
  }
  if (bVar1) {
    srcLength._4_4_ = 0x50;
  }
  return srcLength._4_4_;
}

Assistant:

int strncpy_s(char* dst, size_t dstSizeInBytes, const char* src, size_t maxCount)
{
    int result;
    int truncationFlag = 0;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_020: [If dst is NULL, the error code returned shall be EINVAL and dst shall not be modified.]*/
    if (dst == NULL)
    {
        result = EINVAL;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_99_021: [If src is NULL, the error code returned shall be EINVAL and dst[0] shall be set to 0.]*/
    else if (src == NULL)
    {
        dst[0] = '\0';
        result = EINVAL;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_99_022: [If the dstSizeInBytes is 0, the error code returned shall be EINVAL and dst shall not be modified.]*/
    else if (dstSizeInBytes == 0)
    {
        result = EINVAL;
    }
    else
    {
        size_t srcLength = strlen(src);
        if (maxCount != _TRUNCATE)
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_99_041: [If those N characters will fit within dst (whose size is given as dstSizeInBytes) and still leave room for a null terminator, then those characters shall be copied and a terminating null is appended; otherwise, strDest[0] is set to the null character and ERANGE error code returned.]*/
            if (srcLength > maxCount)
            {
                srcLength = maxCount;
            }

            /*Codes_SRS_CRT_ABSTRACTIONS_99_023: [If dst is not NULL & dstSizeInBytes is smaller than the required size for the src string, the error code returned shall be ERANGE and dst[0] shall be set to 0.]*/
            if (srcLength + 1 > dstSizeInBytes)
            {
                dst[0] = '\0';
                result = ERANGE;
            }
            else
            {
                (void)memcpy(dst, src, srcLength);
                dst[srcLength] = '\0';
                /*Codes_SRS_CRT_ABSTRACTIONS_99_018: [strncpy_s shall return Zero upon success]*/
                result = 0;
            }
        }
        /*Codes_SRS_CRT_ABSTRACTIONS_99_026: [If MaxCount is _TRUNCATE (defined as -1), then as much of src as will fit into dst shall be copied while still leaving room for the terminating null to be appended.]*/
        else
        {
            if (srcLength + 1 > dstSizeInBytes )
            {
                srcLength = dstSizeInBytes - 1;
                truncationFlag = 1;
            }
            (void)memcpy(dst, src, srcLength);
            dst[srcLength] = '\0';
            result = 0;
        }
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_99_019: [If truncation occurred as a result of the copy, the error code returned shall be STRUNCATE.]*/
    if (truncationFlag == 1)
    {
        result = STRUNCATE;
    }

    return result;
}